

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Clara::CommandLine<Catch::ConfigData>::optUsage
          (CommandLine<Catch::ConfigData> *this,ostream *os,size_t indent,size_t width)

{
  Arg *pAVar1;
  ulong uVar2;
  ostream *poVar3;
  ulong uVar4;
  Arg *this_00;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  Arg *this_01;
  string usageCol;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  Text desc;
  Text usage;
  
  pAVar1 = (this->m_options).
           super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = 0;
  this_00 = (this->m_options).
            super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (this_01 = this_00; this_01 != pAVar1; this_01 = this_01 + 1) {
    Arg::commands_abi_cxx11_(&usage.str,this_01);
    if (uVar6 <= usage.str._M_string_length) {
      uVar6 = usage.str._M_string_length;
    }
    std::__cxx11::string::~string((string *)&usage);
  }
  for (; this_00 != pAVar1; this_00 = this_00 + 1) {
    Arg::commands_abi_cxx11_(&desc.str,this_00);
    usageCol._M_dataplus._M_p = (pointer)0xffffffffffffffff;
    usageCol.field_2._M_local_buf[8] = '\t';
    usageCol._M_string_length = indent;
    usageCol.field_2._M_allocated_capacity = uVar6 + indent;
    Catch::Text::Text(&usage,&desc.str,(TextAttributes *)&usageCol);
    std::__cxx11::string::~string((string *)&desc);
    usageCol._M_dataplus._M_p = (pointer)0xffffffffffffffff;
    usageCol._M_string_length = 0;
    usageCol.field_2._M_local_buf[8] = '\t';
    usageCol.field_2._M_allocated_capacity = (width - uVar6) - 3;
    Catch::Text::Text(&desc,&this_00->description,(TextAttributes *)&usageCol);
    lVar7 = 0;
    uVar5 = 0;
    while( true ) {
      uVar2 = (long)usage.lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)usage.lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar4 = (long)desc.lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)desc.lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar4 < uVar2) {
        uVar4 = uVar2;
      }
      if (uVar4 <= uVar5) break;
      if (uVar5 < uVar2) {
        std::__cxx11::string::string
                  ((string *)&usageCol,
                   (string *)
                   ((long)&((usage.lines.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7))
        ;
      }
      else {
        std::__cxx11::string::string((string *)&usageCol,"",(allocator *)local_100);
      }
      std::operator<<(os,(string *)&usageCol);
      if ((uVar5 < (ulong)((long)desc.lines.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)desc.lines.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
         (*(long *)((long)&(desc.lines.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar7) !=
          0)) {
        local_100[0] = local_f0;
        std::__cxx11::string::_M_construct
                  ((ulong)local_100,
                   ((char)indent + (char)uVar6 + '\x02') - (char)usageCol._M_string_length);
        poVar3 = std::operator<<(os,(string *)local_100);
        std::operator<<(poVar3,(string *)
                               ((long)&((desc.lines.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar7));
        std::__cxx11::string::~string((string *)local_100);
      }
      std::operator<<(os,"\n");
      std::__cxx11::string::~string((string *)&usageCol);
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x20;
    }
    Catch::Text::~Text(&desc);
    Catch::Text::~Text(&usage);
  }
  return;
}

Assistant:

void optUsage( std::ostream& os, std::size_t indent = 0, std::size_t width = CATCH_CONFIG_CONSOLE_WIDTH ) const {
            typename std::vector<Arg>::const_iterator itBegin = m_options.begin(), itEnd = m_options.end(), it;
            std::size_t maxWidth = 0;
            for( it = itBegin; it != itEnd; ++it )
                maxWidth = (std::max)( maxWidth, it->commands().size() );

            for( it = itBegin; it != itEnd; ++it ) {
                Catch::Text usage( it->commands(), Catch::TextAttributes()
                                                        .setWidth( maxWidth+indent )
                                                        .setIndent( indent ) );
                // !TBD handle longer usage strings
                Catch::Text desc( it->description, Catch::TextAttributes()
                                                        .setWidth( width - maxWidth -3 ) );

                for( std::size_t i = 0; i < (std::max)( usage.size(), desc.size() ); ++i ) {
                    std::string usageCol = i < usage.size() ? usage[i] : "";
                    os << usageCol;

                    if( i < desc.size() && !desc[i].empty() )
                        os  << std::string( indent + 2 + maxWidth - usageCol.size(), ' ' )
                            << desc[i];
                    os << "\n";
                }
            }
        }